

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

void __thiscall DomLayoutItem::~DomLayoutItem(DomLayoutItem *this)

{
  void *pvVar1;
  long in_RDI;
  DomWidget *in_stack_ffffffffffffffe0;
  DomLayout *this_00;
  
  pvVar1 = *(void **)(in_RDI + 0x40);
  if (pvVar1 != (void *)0x0) {
    DomWidget::~DomWidget(in_stack_ffffffffffffffe0);
    operator_delete(pvVar1,0x160);
  }
  this_00 = *(DomLayout **)(in_RDI + 0x48);
  if (this_00 != (DomLayout *)0x0) {
    DomLayout::~DomLayout(this_00);
    operator_delete(this_00,0x128);
  }
  pvVar1 = *(void **)(in_RDI + 0x50);
  if (pvVar1 != (void *)0x0) {
    DomSpacer::~DomSpacer((DomSpacer *)this_00);
    operator_delete(pvVar1,0x38);
  }
  QString::~QString((QString *)0x1afe44);
  return;
}

Assistant:

DomLayoutItem::~DomLayoutItem()
{
    delete m_widget;
    delete m_layout;
    delete m_spacer;
}